

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSerialize.cpp
# Opt level: O0

void __thiscall TTD::FileWriter::WriteBlock(FileWriter *this,byte *buff,size_t bufflen)

{
  size_t local_28;
  size_t bwp;
  size_t bufflen_local;
  byte *buff_local;
  FileWriter *this_local;
  
  bwp = bufflen;
  bufflen_local = (size_t)buff;
  buff_local = (byte *)this;
  if (bufflen == 0) {
    TTDAbort_unrecoverable_error("Shouldn\'t be writing empty blocks");
  }
  if (this->m_hfile == (JsTTDStreamHandle)0x0) {
    TTDAbort_unrecoverable_error("Trying to write to closed file.");
  }
  local_28 = 0;
  (*this->m_pfWrite)(this->m_hfile,buff,bufflen,&local_28);
  return;
}

Assistant:

void FileWriter::WriteBlock(const byte* buff, size_t bufflen)
    {
        TTDAssert(bufflen != 0, "Shouldn't be writing empty blocks");
        TTDAssert(this->m_hfile != nullptr, "Trying to write to closed file.");

        size_t bwp = 0;
        this->m_pfWrite(this->m_hfile, buff, bufflen, &bwp);
    }